

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O2

void __thiscall icu_63::ICUService::reset(ICUService *this)

{
  Mutex mutex;
  Mutex local_10;
  
  local_10.fMutex = (UMutex *)icu_63::lock;
  umtx_lock_63((UMutex *)icu_63::lock);
  (*(this->super_ICUNotifier)._vptr_ICUNotifier[0x10])(this);
  (*(this->super_ICUNotifier)._vptr_ICUNotifier[0x12])(this);
  Mutex::~Mutex(&local_10);
  (*(this->super_ICUNotifier)._vptr_ICUNotifier[4])(this);
  return;
}

Assistant:

void 
ICUService::reset() 
{
    {
        Mutex mutex(&lock);
        reInitializeFactories();
        clearCaches();
    }
    notifyChanged();
}